

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O0

int resolve_symbolnames(dl_phdr_info *info,size_t info_size,void *data)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  long in_RDX;
  uint64_t *in_RDI;
  uint32_t lib_cnt;
  char executable_path [4096];
  uint8_t header;
  lua_State *L;
  lj_wbuf *buf;
  symbol_resolver_conf *conf;
  char *s;
  undefined4 in_stack_ffffffffffffefb0;
  char local_1048 [48];
  lj_wbuf *in_stack_ffffffffffffefe8;
  uint8_t in_stack_ffffffffffffeff7;
  dl_phdr_info *in_stack_ffffffffffffeff8;
  Elf64_Addr in_stack_fffffffffffff0d0;
  uint8_t in_stack_fffffffffffff0df;
  lua_State *in_stack_fffffffffffff0e0;
  lj_wbuf *in_stack_fffffffffffff0e8;
  char *in_stack_fffffffffffff0f0;
  int local_4;
  
  memset(local_1048,0,0x1000);
  iVar1 = (int)in_RDI[4] - **(int **)(in_RDX + 0x20);
  s = (char *)*in_RDI;
  pcVar3 = (char *)getauxval(0x21);
  if (s == pcVar3) {
    local_4 = 0;
  }
  else {
    iVar2 = (int)in_RDI[4] - **(int **)(in_RDX + 0x20);
    *(int *)(in_RDX + 0x18) = iVar2;
    if (iVar2 == 0) {
      local_4 = 1;
    }
    else if (*(uint *)(in_RDX + 0x14) < (uint)(iVar1 - *(int *)(in_RDX + 0x18))) {
      *(int *)(in_RDX + 0x14) = *(int *)(in_RDX + 0x14) + 1;
      local_4 = 0;
    }
    else {
      if (*(int *)(in_RDX + 0x14) == (iVar1 - *(int *)(in_RDX + 0x18)) + -1) {
        **(undefined4 **)(in_RDX + 0x20) = (int)in_RDI[4];
      }
      if ((*(char *)in_RDI[1] == '\0') &&
         (sVar4 = readlink("/proc/self/exe",local_1048,0x1000), sVar4 != -1)) {
        in_RDI[1] = (uint64_t)local_1048;
      }
      iVar2 = dump_sht_symtab(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
                              in_stack_fffffffffffff0e0,in_stack_fffffffffffff0df,
                              in_stack_fffffffffffff0d0);
      if (iVar2 == 0) {
        *(int *)(in_RDX + 0x14) = *(int *)(in_RDX + 0x14) + 1;
      }
      else {
        iVar2 = dump_dyn_symtab(in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff7,
                                in_stack_ffffffffffffefe8);
        if (iVar2 == 0) {
          *(int *)(in_RDX + 0x14) = *(int *)(in_RDX + 0x14) + 1;
        }
        else {
          lj_wbuf_addbyte((lj_wbuf *)CONCAT44(iVar1,in_stack_ffffffffffffefb0),
                          (uint8_t)((ulong)s >> 0x38));
          lj_wbuf_addu64((lj_wbuf *)CONCAT44(iVar1,in_stack_ffffffffffffefb0),(uint64_t)s);
          lj_wbuf_addstring((lj_wbuf *)CONCAT44(iVar1,in_stack_ffffffffffffefb0),s);
          *(int *)(in_RDX + 0x14) = *(int *)(in_RDX + 0x14) + 1;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int resolve_symbolnames(struct dl_phdr_info *info, size_t info_size,
			       void *data)
{
  struct symbol_resolver_conf *conf = data;
  struct lj_wbuf *buf = conf->buf;
  lua_State *L = conf->L;
  const uint8_t header = conf->header;
  char executable_path[PATH_MAX] = {0};

  uint32_t lib_cnt = 0;

  /*
  ** Check that dlpi_adds and dlpi_subs fields are available.
  ** Assertion was taken from the GLIBC tests:
  ** https://code.woboq.org/userspace/glibc/elf/tst-dlmodcount.c.html#37
  */
  lj_assertL(info_size > offsetof(struct dl_phdr_info, dlpi_subs)
			 + sizeof(info->dlpi_subs),
	     "bad dlpi_subs");

  lib_cnt = info->dlpi_adds - *conf->lib_adds;

  /* Skip vDSO library. */
  if (info->dlpi_addr == getauxval(AT_SYSINFO_EHDR))
    return 0;

  if ((conf->to_dump_cnt = info->dlpi_adds - *conf->lib_adds) == 0)
    /* No new libraries, stop resolver. */
    return 1;

  if (conf->cur_lib < lib_cnt - conf->to_dump_cnt) {
    /* That lib is already dumped, skip it. */
    ++conf->cur_lib;
    return 0;
  }

  if (conf->cur_lib == lib_cnt - conf->to_dump_cnt - 1)
    /* Last library, update memrpof's lib counter. */
    *conf->lib_adds = info->dlpi_adds;

  /*
  ** The `dl_iterate_phdr` returns an empty string as a name for
  ** the executable from which it was called. It is still possible
  ** to access its dynamic symbol table, but it is vital for
  ** sysprof to obtain the main symbol table for the LuaJIT
  ** executable. To do so, we need a valid path to the executable.
  ** Since there is no way to obtain the path to a running
  ** executable using the C standard library, the only more or
  ** less reliable way to do this is by reading the symbolic link
  ** from `/proc/self/exe`. Most of the UNIX-based systems have
  ** procfs, so it is not a problem.
  ** Such path tweaks relate only for the main way (see below).
  */
  if (*info->dlpi_name == '\0') {
    if (readlink("/proc/self/exe", executable_path, PATH_MAX) != -1)
      info->dlpi_name = executable_path;
    else
      /*
      ** It is impossible for sysprof to work properly without the
      ** LuaJIT's .symtab section present. The assertion below is
      ** unlikely to be triggered on any system supported by
      ** sysprof, unless someone have deleted the LuaJIT binary
      ** right after the start.
      */
      lj_assertL(0, "bad executed binary symtab section");
  }

  /*
  ** Main way: try to open ELF and read SHT_SYMTAB, SHT_STRTAB and SHT_HASH
  ** sections from it.
  */
  if (dump_sht_symtab(info->dlpi_name, buf, L, header, info->dlpi_addr) == 0) {
    ++conf->cur_lib;
  }
  /* First fallback: dump functions only from PT_DYNAMIC segment. */
  else if(dump_dyn_symtab(info, header, buf) == 0) {
    ++conf->cur_lib;
  }
  /*
  ** Last resort: dump ELF size and address to show .so name for its functions
  ** in memprof output.
  */
  else {
    lj_wbuf_addbyte(buf, SYMTAB_CFUNC);
    lj_wbuf_addu64(buf, info->dlpi_addr);
    lj_wbuf_addstring(buf, info->dlpi_name);
    ++conf->cur_lib;
  }

  return 0;
}